

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void Fossilize::Hashing::hash_application_feature_info
               (Hasher *hasher,StateRecorderApplicationFeatureHash *base_hash)

{
  hasher->h = (base_hash->physical_device_features_hash & 0xffffffff ^
              ((base_hash->application_info_hash & 0xffffffff ^ hasher->h * 0x100000001b3) *
               0x100000001b3 ^ base_hash->application_info_hash >> 0x20) * 0x100000001b3) *
              0x100000001b3 ^ base_hash->physical_device_features_hash >> 0x20;
  return;
}

Assistant:

static void hash_application_feature_info(Hasher &hasher, const StateRecorderApplicationFeatureHash &base_hash)
{
	// This makes it so two different applications won't conflict if they use the same pipelines.
	hasher.u64(base_hash.application_info_hash);
	hasher.u64(base_hash.physical_device_features_hash);
}